

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void GA_Zgemm_c(char ta,char tb,int m,int n,int k,DoubleComplex alpha,int g_a,int g_b,
               DoubleComplex beta,int g_c)

{
  char tb_local;
  char ta_local;
  long local_60;
  long local_58;
  DoubleComplex beta_local;
  DoubleComplex alpha_local;
  
  beta_local.imag = beta.imag;
  beta_local.real = beta.real;
  alpha_local.imag = alpha.imag;
  alpha_local.real = alpha.real;
  local_58 = (long)g_b;
  local_60 = (long)g_c;
  tb_local = tb;
  ta_local = ta;
  pnga_matmul(&ta_local,&tb_local,&alpha_local,&beta_local,(long)g_a,1,(long)m,1,(long)k,local_58,1,
              (long)k,1,(long)n,local_60,1,(long)m,1,(long)n);
  return;
}

Assistant:

void GA_Zgemm_c(char ta, char tb, int m, int n, int k,
              DoubleComplex alpha, int g_a, int g_b, 
	      DoubleComplex beta, int g_c )
{
  Integer G_a = g_a;
  Integer G_b = g_b;
  Integer G_c = g_c;

  Integer ailo = 1;
  Integer aihi = m;
  Integer ajlo = 1;
  Integer ajhi = k;
  
  Integer bilo = 1;
  Integer bihi = k;
  Integer bjlo = 1;
  Integer bjhi = n;
  
  Integer cilo = 1;
  Integer cihi = m;
  Integer cjlo = 1;
  Integer cjhi = n;
  
  pnga_matmul(&ta, &tb, (DoublePrecision *)&alpha,(DoublePrecision *)&beta,
	    G_a, ailo, aihi, ajlo, ajhi,
	    G_b, bilo, bihi, bjlo, bjhi,
	    G_c, cilo, cihi, cjlo, cjhi);
}